

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O1

void __thiscall DataSet::load(DataSet *this,string *filepath,uint ignored_lines,bool auto_read)

{
  char *pcVar1;
  int iVar2;
  pointer pvVar3;
  bool bVar4;
  double dVar5;
  _Alloc_hider __nptr;
  char cVar6;
  value_type_conflict1 *__val;
  istream *piVar7;
  int *piVar8;
  long lVar9;
  iterator iVar10;
  ulong uVar11;
  ulong uVar12;
  string line;
  vector<double,_std::allocator<double>_> inputs;
  vector<double,_std::allocator<double>_> out;
  uint dims [2];
  stringstream stream;
  ifstream file;
  stringstream stream_1;
  uint local_5f0;
  uint local_5ec;
  key_type local_5e8;
  value_type local_5c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_5a8;
  ulong local_578;
  uint local_570 [2];
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
  *local_568;
  Matrix *local_560;
  _Base_ptr local_558;
  double local_550;
  long local_548 [2];
  ostream local_538 [112];
  ios_base local_4c8 [264];
  long local_3c0 [4];
  byte abStack_3a0 [488];
  pointer local_1b8 [2];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::string::_M_assign((string *)&this->m_filePath);
  std::__cxx11::stringstream::stringstream((stringstream *)local_548);
  local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
  local_5e8._M_string_length = 0;
  local_5e8.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(local_3c0,(string *)filepath,_S_in);
  if ((abStack_3a0[*(long *)(local_3c0[0] + -0x18)] & 5) != 0) {
LAB_00106f07:
    std::operator<<((ostream *)&std::cout,"ERROR [load file]: Couldn\'t load the dataset file!\n");
    exit(1);
  }
  local_5c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_5c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_5c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  if (ignored_lines == 0 && !auto_read) {
    cVar6 = std::ios::widen((char)*(undefined8 *)(local_3c0[0] + -0x18) + (char)local_3c0);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_3c0,(string *)&local_5e8,cVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_538,local_5e8._M_dataplus._M_p,local_5e8._M_string_length);
    uVar12 = 0;
    while (piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)local_548,(string *)&local_5e8,','),
          __nptr._M_p = local_5e8._M_dataplus._M_p,
          ((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) == 0) {
      piVar8 = __errno_location();
      iVar2 = *piVar8;
      *piVar8 = 0;
      lVar9 = strtol(__nptr._M_p,local_1b8,10);
      if (local_1b8[0] == __nptr._M_p) {
        std::__throw_invalid_argument("stoi");
LAB_00106efb:
        std::__throw_out_of_range("stoi");
        goto LAB_00106f07;
      }
      if (((int)(uint)lVar9 != lVar9) || (*piVar8 == 0x22)) goto LAB_00106efb;
      if (*piVar8 == 0) {
        *piVar8 = iVar2;
      }
      local_570[uVar12] = (uint)lVar9;
      uVar12 = (ulong)((int)uVar12 + 1);
    }
    Matrix::set_shape(&this->m_inputSet,local_570[0],local_570[1] - 1);
    Matrix::set_shape(&this->m_outputSet,local_570[0],1);
    std::ios::clear((int)local_548 + (int)*(undefined8 *)(local_548[0] + -0x18));
  }
  local_568 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
               *)&this->m_map;
  local_558 = &(this->m_map)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_560 = &this->m_outputSet;
  local_578 = 0;
  uVar12 = 0;
  local_5f0 = 0;
  local_5ec = 0;
  while( true ) {
    cVar6 = std::ios::widen((char)*(undefined8 *)(local_3c0[0] + -0x18) + (char)(istream *)local_3c0
                           );
    piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_3c0,(string *)&local_5e8,cVar6);
    if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
      pvVar3 = (this->m_inputSet).m_vals.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (this->m_inputSet).m_shape.field_0.m_dims[0] =
           (int)((ulong)((long)(this->m_inputSet).m_vals.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) >> 3) *
           -0x55555555;
      (this->m_inputSet).m_shape.field_0.m_dims[1] =
           (uint)((ulong)((long)*(pointer *)
                                 ((long)&pvVar3->super__Vector_base<double,_std::allocator<double>_>
                                 + 8) -
                         *(long *)&pvVar3->super__Vector_base<double,_std::allocator<double>_>) >> 3
                 );
      pvVar3 = (this->m_outputSet).m_vals.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (this->m_outputSet).m_shape.field_0.m_dims[0] =
           (int)((ulong)((long)(this->m_outputSet).m_vals.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) >> 3) *
           -0x55555555;
      (this->m_outputSet).m_shape.field_0.m_dims[1] =
           (uint)((ulong)((long)*(pointer *)
                                 ((long)&(pvVar3->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl + 8) -
                         *(long *)&(pvVar3->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl) >> 3);
      std::ifstream::close();
      if (local_5c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_5c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_5c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_5c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::ifstream::~ifstream(local_3c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
        operator_delete(local_5e8._M_dataplus._M_p,
                        CONCAT71(local_5e8.field_2._M_allocated_capacity._1_7_,
                                 local_5e8.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_548);
      std::ios_base::~ios_base(local_4c8);
      return;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_5e8._M_dataplus._M_p,local_5e8._M_string_length);
    local_5f0 = local_5f0 + 1;
    if (ignored_lines < local_5f0) break;
LAB_00106e03:
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
LAB_00106b6e:
  do {
    uVar11 = (ulong)local_5ec;
    uVar12 = uVar12 & 0xffffffff;
    while( true ) {
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1b8,(string *)&local_5e8,',');
      if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
        if (ignored_lines < local_5f0 && auto_read) {
          local_5a8.first._M_dataplus._M_p = (pointer)0x0;
          local_5a8.first._M_string_length = 0;
          local_5a8.first.field_2._M_allocated_capacity = 0;
          local_5a8.first._M_dataplus._M_p = (pointer)operator_new(8);
          local_5a8.first._M_string_length = (long)local_5a8.first._M_dataplus._M_p + 8;
          *(size_type *)local_5a8.first._M_dataplus._M_p = 0;
          *(double *)local_5a8.first._M_dataplus._M_p =
               local_5c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish[-1];
          local_5a8.first.field_2._M_allocated_capacity = local_5a8.first._M_string_length;
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::push_back(&local_560->m_vals,(value_type *)&local_5a8);
          local_5c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_5c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)this,&local_5c8);
          if (local_5c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_5c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start) {
            local_5c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_5c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5a8.first._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_5a8.first._M_dataplus._M_p,
                            local_5a8.first.field_2._M_allocated_capacity -
                            (long)local_5a8.first._M_dataplus._M_p);
          }
        }
        goto LAB_00106e03;
      }
      if (auto_read) {
        bVar4 = local_5e8._M_string_length != 0;
        if (local_5e8._M_string_length == 0) goto LAB_00106c2a;
        if (*local_5e8._M_dataplus._M_p != '.' && 9 < (byte)(*local_5e8._M_dataplus._M_p - 0x30U))
        goto LAB_00106c32;
        uVar11 = 1;
        goto LAB_00106bfe;
      }
      dVar5 = strtod(local_5e8._M_dataplus._M_p,(char **)0x0);
      if (local_570[1] - 1 <= (uint)uVar12) break;
      *(double *)
       (*(long *)&(this->m_inputSet).m_vals.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar11].
                  super__Vector_base<double,_std::allocator<double>_> + uVar12 * 8) = dVar5;
      uVar12 = uVar12 + 1;
    }
    local_5ec = local_5ec + 1;
    **(double **)
      &(this->m_outputSet).m_vals.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[uVar11].
       super__Vector_base<double,_std::allocator<double>_>._M_impl = dVar5;
    uVar12 = 0;
  } while( true );
  while (pcVar1 = local_5e8._M_dataplus._M_p + uVar11, uVar11 = (ulong)((int)uVar11 + 1),
        *pcVar1 == '.' || (byte)(*pcVar1 - 0x30U) < 10) {
LAB_00106bfe:
    bVar4 = uVar11 < local_5e8._M_string_length;
    if (local_5e8._M_string_length <= uVar11) break;
  }
LAB_00106c2a:
  if (bVar4) {
LAB_00106c32:
    iVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     *)local_568,&local_5e8);
    if (iVar10._M_node == local_558) {
      local_5a8.first._M_dataplus._M_p = (pointer)&local_5a8.first.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_5a8,local_5e8._M_dataplus._M_p,
                 local_5e8._M_dataplus._M_p + local_5e8._M_string_length);
      local_5a8.second = (int)local_578 + 1;
      local_578 = (ulong)local_5a8.second;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
      ::_M_insert_unique<std::pair<std::__cxx11::string_const,unsigned_int>>(local_568,&local_5a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8.first._M_dataplus._M_p != &local_5a8.first.field_2) {
        operator_delete(local_5a8.first._M_dataplus._M_p,
                        local_5a8.first.field_2._M_allocated_capacity + 1);
      }
    }
    local_550 = (double)((int)local_578 - 1);
  }
  else {
    local_550 = strtod(local_5e8._M_dataplus._M_p,(char **)0x0);
  }
  if (local_5c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_5c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&local_5c8,
               (iterator)
               local_5c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_550);
  }
  else {
    *local_5c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_finish = local_550;
    local_5c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_5c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  goto LAB_00106b6e;
}

Assistant:

void DataSet::load(const std::string& filepath, uint ignored_lines, bool auto_read){
    m_filePath=filepath;

    std::stringstream stream;
    std::string line;
    std::ifstream file(filepath);

    if(!file){
        std::cout<<"ERROR [load file]: Couldn't load the dataset file!\n";
        exit(1);
    }

    uint dims[2], i=0, j=0, n_lines=0, word_count=0;
    std::vector<double> inputs;
    double val;

    if(!ignored_lines && !auto_read){
        std::getline(file, line);
        stream<<line;
        // std::cout<<" dbg first line: "<<line<<'\n';
        while(std::getline(stream, line, ',')){
            // std::cout<<" dbg token: "<<line<<'\n';
            dims[i++]=std::stoi(line);
            // std::cout<<" dims #"<<i-1<<": "<<dims[i-1]<<'\n';
        }
        // std::cout<<" dbg parsed\n";
        m_inputSet.set_shape(dims[0], dims[1]-1);
        m_outputSet.set_shape(dims[0], 1);
        i=0;
        stream.clear();
    }

    // std::cout<<" dbg dims: "<<dims[0]<<", "<<dims[1]<<'\n';
    // std::cout<<" dbg input shape: "<<m_inputSet.shape()<<"; output shape: "<<m_outputSet.shape()<<'\n';

    while(std::getline(file, line)){
        std::stringstream stream;
        stream<<line;
        // std::cout<<" dbg auto-reading line: "<<stream.str()<<"\n";
        if(ignored_lines>=++n_lines) continue;
        while(std::getline(stream, line, ',')){
            if(auto_read){
                // std::cout<<" > "<<line;
                if(is_word(line)){
                    // std::cout<<" +\n";
                    if(m_map.find(line)==m_map.end()){
                        // std::cout<<"Not Found!\n";
                        m_map.insert({line, ++word_count});
                    }
                    val=word_count-1;
                }
                else{
                    // std::cout<<" -\n";
                    val=strtod(line.c_str(), nullptr);
                }
                inputs.push_back(val);
            }
            else{
                if(j<dims[1]-1){
                    // std::cout<<" dbg writing inputSet\n";
                    m_inputSet.m_vals[i][j++]=strtod(line.c_str(), nullptr);
                }
                else{
                    // std::cout<<" dbg writing outputSet\n";
                    m_outputSet.m_vals[i++][0]=strtod(line.c_str(), nullptr);
                    j=0;
                }
            }
        }
        // std::cout<<"\nClearing stream\n";
        if(auto_read && ignored_lines<n_lines){
            // std::cout<<" > pushing the data back\n";
            std::vector<double> out(1);
            out[0]=inputs[inputs.size()-1];
            m_outputSet.m_vals.push_back(out);
            inputs.erase(inputs.end()-1);
            m_inputSet.m_vals.push_back(inputs);
            inputs.clear();
        }
        // stream.clear();
    }

    update();
    file.close();
}